

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_function.c
# Opt level: O1

function_return
function_await(function_conflict func,void **args,size_t size,
              function_resolve_callback resolve_callback,function_reject_callback reject_callback,
              void *context)

{
  function_impl_interface_await p_Var1;
  function_return pvVar2;
  
  if (((args != (void **)0x0 && func != (function_conflict)0x0) &&
      (func->interface != (function_interface)0x0)) &&
     (p_Var1 = func->interface->await, p_Var1 != (function_impl_interface_await)0x0)) {
    pvVar2 = (*p_Var1)(func,func->impl,args,size,resolve_callback,reject_callback,context);
    return pvVar2;
  }
  return (function_return)0x0;
}

Assistant:

function_return function_await(function func, function_args args, size_t size, function_resolve_callback resolve_callback, function_reject_callback reject_callback, void *context)
{
	if (func != NULL && args != NULL)
	{
		if (func->interface != NULL && func->interface->await != NULL)
		{
			/* TODO: Disable logs here until log is completely thread safe and async signal safe */

			/*
			if (func->name == NULL)
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Await annonymous function with args <%p>", (void *)args);
			}
			else
			{
				log_write("metacall", LOG_LEVEL_DEBUG, "Await function (%s) with args <%p>", func->name, (void *)args);
			}
			*/

			return func->interface->await(func, func->impl, args, size, resolve_callback, reject_callback, context);
		}
	}

	return NULL;
}